

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::ParamAssignmentSyntax::isKind(SyntaxKind kind)

{
  bool local_9;
  SyntaxKind kind_local;
  
  if ((kind == NamedParamAssignment) || (kind == OrderedParamAssignment)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool ParamAssignmentSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::NamedParamAssignment:
        case SyntaxKind::OrderedParamAssignment:
            return true;
        default:
            return false;
    }
}